

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPSources::BYETimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  byte bVar2;
  RTPInternalSourceData *obj;
  HashElement *pHVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  
  dVar7 = curtime->m_t - timeoutdelay->m_t;
  pHVar3 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar3;
  iVar4 = 0;
  iVar5 = 0;
  iVar6 = 0;
LAB_001258b3:
  do {
    if (pHVar3 == (HashElement *)0x0) {
      this->totalcount = iVar6;
      this->sendercount = iVar4;
      this->activecount = iVar5;
      return;
    }
    obj = pHVar3->element;
    if ((obj->super_RTPSourceData).receivedbye == true) {
      if ((obj != this->owndata) &&
         (pRVar1 = &(obj->super_RTPSourceData).byetime, pRVar1->m_t <= dVar7 && dVar7 != pRVar1->m_t
         )) {
        this->totalcount = this->totalcount + -1;
        if ((obj->super_RTPSourceData).issender == true) {
          this->sendercount = this->sendercount + -1;
        }
        if (((obj->super_RTPSourceData).validated == true) &&
           (((obj->super_RTPSourceData).receivedbye & 1U) == 0)) {
          this->activecount = this->activecount + -1;
        }
        RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
        ::DeleteCurrentElement(&this->sourcelist);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,obj);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,obj);
        RTPDelete<jrtplib::RTPInternalSourceData>(obj,(this->super_RTPMemoryObject).mgr);
        pHVar3 = (this->sourcelist).curhashelem;
        goto LAB_001258b3;
      }
      bVar2 = (obj->super_RTPSourceData).issender;
    }
    else {
      bVar2 = (obj->super_RTPSourceData).issender;
      iVar5 = iVar5 + (uint)(obj->super_RTPSourceData).validated;
    }
    iVar4 = iVar4 + (uint)bVar2;
    iVar6 = iVar6 + 1;
    pHVar3 = pHVar3->listnext;
    (this->sourcelist).curhashelem = pHVar3;
  } while( true );
}

Assistant:

void RTPSources::BYETimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		
		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (checktime > byetime))
			{
				totalcount--;
				if (srcdat->IsSender())
					sendercount--;
				if (srcdat->IsActive())
					activecount--;
				sourcelist.DeleteCurrentElement();
				OnBYETimeout(srcdat);
				OnRemoveSource(srcdat);
				RTPDelete(srcdat,GetMemoryManager());
			}
			else
			{
				newtotalcount++;
				if (srcdat->IsSender())
					newsendercount++;
				if (srcdat->IsActive())
					newactivecount++;
				sourcelist.GotoNextElement();
			}
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}